

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_vad.c
# Opt level: O2

int ps_vad_set_input_params(ps_vad_t *vad,int sample_rate,double frame_length)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  uint rate;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  
  uVar5 = 16000;
  if (sample_rate != 0) {
    uVar5 = sample_rate;
  }
  dVar7 = 0.5;
  rate = 0;
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 4) {
    dVar8 = ABS(1.0 - (double)(int)*(uint *)((long)sample_rates + lVar3) / (double)(int)uVar5);
    uVar1 = *(uint *)((long)sample_rates + lVar3);
    if (dVar7 <= dVar8) {
      dVar8 = dVar7;
      uVar1 = rate;
    }
    rate = uVar1;
    dVar7 = dVar8;
  }
  if (rate == 0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_vad.c"
            ,0x6f,"No suitable sampling rate found for %d\n",(ulong)uVar5);
    iVar2 = -1;
  }
  else {
    dVar8 = (double)(~-(ulong)(frame_length == 0.0) & (ulong)frame_length |
                    -(ulong)(frame_length == 0.0) & 0x3f9eb851eb851eb8);
    dVar7 = (double)(int)rate * dVar8;
    uVar4 = (ulong)dVar7;
    uVar4 = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
    if (rate != uVar5) {
      auVar6._8_4_ = (int)(uVar4 >> 0x20);
      auVar6._0_8_ = uVar4;
      auVar6._12_4_ = 0x45300000;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_vad.c"
              ,0x75,"Closest supported sampling rate to %d is %d, frame size %d (%.3fs)\n",
              ((auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) / (double)(int)uVar5,
              (ulong)uVar5,(ulong)rate,uVar4);
    }
    iVar2 = WebRtcVad_ValidRateAndFrameLength(rate,uVar4);
    if (iVar2 < 0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_vad.c"
              ,0x78,"Unsupported frame length %f\n",dVar8);
    }
    else {
      vad->sample_rate = uVar5;
      vad->closest_sample_rate = rate;
      vad->frame_size = (int)uVar4;
    }
  }
  return iVar2;
}

Assistant:

int
ps_vad_set_input_params(ps_vad_t *vad, int sample_rate, double frame_length)
{
    size_t frame_size;
    int i, rv;
    int closest_sample_rate = 0;
    double best_diff = 0.5;

    if (sample_rate == 0)
        sample_rate = PS_VAD_DEFAULT_SAMPLE_RATE;
    if (frame_length == 0)
        frame_length = PS_VAD_DEFAULT_FRAME_LENGTH;
    for (i = 0; i < n_sample_rates; ++i) {
        double diff = fabs(1.0 - (double)sample_rates[i] / sample_rate);
        if (diff < best_diff) {
            closest_sample_rate = sample_rates[i];
            best_diff = diff;
        }
    }
    if (closest_sample_rate == 0) {
        E_ERROR("No suitable sampling rate found for %d\n", sample_rate);
        return -1;
    }
    frame_size = (size_t)(closest_sample_rate * frame_length);
    if (closest_sample_rate != sample_rate) {
        E_INFO("Closest supported sampling rate to %d is %d, frame size %d (%.3fs)\n",
               sample_rate, closest_sample_rate, frame_size, (double)frame_size / sample_rate);
    }
    if ((rv = WebRtcVad_ValidRateAndFrameLength(closest_sample_rate, frame_size)) < 0) {
        E_WARN("Unsupported frame length %f\n", frame_length);
        return rv;
    }
    vad->sample_rate = sample_rate;
    vad->closest_sample_rate = closest_sample_rate;
    vad->frame_size = frame_size;
    return rv;
}